

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

difference_type
QtPrivate::sequential_erase_with_copy<QList<QString>,QString>(QList<QString> *c,QString *t)

{
  difference_type dVar1;
  long in_FS_OFFSET;
  QString local_38;
  anon_class_8_1_54a39814_for__M_pred local_20;
  long local_18;
  
  local_20.t = &local_38;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.d = (t->d).d;
  local_38.d.ptr = (t->d).ptr;
  local_38.d.size = (t->d).size;
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_38.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_38.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  dVar1 = sequential_erase_if<QList<QString>,QtPrivate::sequential_erase<QList<QString>,QString>(QList<QString>&,QString_const&)::_lambda(auto:1_const&)_1_>
                    (c,&local_20);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return dVar1;
  }
  __stack_chk_fail();
}

Assistant:

auto sequential_erase_with_copy(Container &c, const T &t)
{
    using CopyProxy = std::conditional_t<std::is_copy_constructible_v<T>, T, const T &>;
    return sequential_erase(c, CopyProxy(t));
}